

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_285d7d::SndioCapture::open(SndioCapture *this,char *__file,int __oflag,...)

{
  DevFmtType DVar1;
  ALCdevice *pAVar2;
  RingBuffer *ptr;
  char *pcVar3;
  atomic<unsigned_long> aVar4;
  int iVar5;
  uint uVar6;
  backend_exception *pbVar7;
  sio_hdl *psVar8;
  ALCchar *pAVar9;
  ALCchar *pAVar10;
  sio_par par;
  __atomic_base<unsigned_long> local_28;
  
  if (__file == (char *)0x0) {
    __file = "SndIO Default";
  }
  else {
    iVar5 = strcmp(__file,"SndIO Default");
    if (iVar5 != 0) {
      pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar7,0xa004,"Device name \"%s\" not found",__file);
      __cxa_throw(pbVar7,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
  }
  psVar8 = (sio_hdl *)sio_open(0,2,0);
  this->mSndHandle = psVar8;
  if (psVar8 == (sio_hdl *)0x0) {
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(pbVar7,0xa004,"Could not open backend device");
    goto LAB_001661bf;
  }
  sio_initpar(&par);
  pAVar2 = (this->super_BackendBase).mDevice;
  switch(pAVar2->FmtType) {
  case DevFmtByte:
    par.bps = 1;
    par.sig = 1;
    break;
  case DevFmtUByte:
    par.bps = 1;
    par.sig = 0;
    break;
  case DevFmtShort:
    par.bps = 2;
    par.sig = 1;
    goto LAB_00165eaf;
  case DevFmtUShort:
    par.bps = 2;
    par.sig = 0;
LAB_00165eaf:
    par.bits = 0x10;
    goto LAB_00165edd;
  case DevFmtInt:
    par.bps = 4;
    par.sig = 1;
    goto LAB_00165ecf;
  case DevFmtUInt:
    par.bps = 4;
    par.sig = 0;
LAB_00165ecf:
    par.bits = 0x20;
    goto LAB_00165edd;
  case DevFmtFloat:
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar9 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar7,0xa004,"%s capture samples not supported",pAVar9);
    goto LAB_001661bf;
  default:
    par.bits = par.bps << 3;
    goto LAB_00165edd;
  }
  par.bits = 8;
LAB_00165edd:
  par.le = 1;
  par.msb = 0;
  par.rchan = ChannelsFromDevFmt(pAVar2->FmtChans,pAVar2->mAmbiOrder);
  pAVar2 = (this->super_BackendBase).mDevice;
  par.rate = pAVar2->Frequency;
  par.appbufsz = par.rate / 10;
  if (par.rate / 10 < pAVar2->BufferSize) {
    par.appbufsz = pAVar2->BufferSize;
  }
  par.round = par.rate / 0x28;
  if (par.appbufsz < par.rate / 0x28) {
    par.round = par.appbufsz;
  }
  pAVar2->UpdateSize = par.round;
  pAVar2->BufferSize = par.appbufsz;
  iVar5 = sio_setpar(this->mSndHandle,&par);
  if ((iVar5 == 0) || (iVar5 = sio_getpar(this->mSndHandle,&par), iVar5 == 0)) {
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(pbVar7,0xa004,"Failed to set device praameters");
  }
  else if (par.bits == par.bps << 3) {
    pAVar2 = (this->super_BackendBase).mDevice;
    DVar1 = pAVar2->FmtType;
    if (((((((par.bits == 8 && DVar1 == DevFmtByte) && par.sig != 0) ||
           ((DVar1 == DevFmtUByte && par.bits == 8) && par.sig == 0)) ||
          ((par.bits == 0x10 && DVar1 == DevFmtShort) && par.sig != 0)) ||
         (((DVar1 == DevFmtUShort && par.bits == 0x10) && par.sig == 0 ||
          ((par.bits == 0x20 && DVar1 == DevFmtInt) && par.sig != 0)))) ||
        ((par.bits == 0x20 && ((DVar1 == DevFmtUInt && (par.sig == 0)))))) &&
       ((uVar6 = ChannelsFromDevFmt(pAVar2->FmtChans,pAVar2->mAmbiOrder), uVar6 == par.rchan &&
        (pAVar2 = (this->super_BackendBase).mDevice, pAVar2->Frequency == par.rate)))) {
      RingBuffer::Create((RingBuffer *)&stack0xffffffffffffffd8,(ulong)pAVar2->BufferSize,
                         (ulong)(uVar6 * par.bps),0);
      aVar4.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_28._M_i;
      local_28._M_i = 0;
      ptr = (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>.
            _M_t.super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
            super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
      (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
      super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
      super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl =
           (RingBuffer *)aVar4.super___atomic_base<unsigned_long>._M_i;
      if ((ptr != (RingBuffer *)0x0) && (al_free(ptr), (void *)local_28._M_i != (void *)0x0)) {
        al_free((void *)local_28._M_i);
      }
      BackendBase::setDefaultChannelOrder(&this->super_BackendBase);
      pAVar2 = (this->super_BackendBase).mDevice;
      pcVar3 = (char *)(pAVar2->DeviceName)._M_string_length;
      strlen(__file);
      iVar5 = std::__cxx11::string::_M_replace((ulong)&pAVar2->DeviceName,0,pcVar3,(ulong)__file);
      return iVar5;
    }
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar9 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    pAVar10 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
    al::backend_exception::backend_exception
              (pbVar7,0xa004,"Failed to set format %s %s %uhz, got %c%u %u-channel %uhz instead",
               pAVar9,pAVar10,(ulong)((this->super_BackendBase).mDevice)->Frequency,
               (ulong)((uint)(par.sig == 0) * 2 + 0x73),(ulong)par.bits,(ulong)par.rchan,
               (ulong)par.rate);
  }
  else {
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception
              (pbVar7,0xa004,"Padded samples not supported (got %u of %u bits)",(ulong)par.bits,
               (ulong)(par.bps << 3));
  }
LAB_001661bf:
  __cxa_throw(pbVar7,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void SndioCapture::open(const ALCchar *name)
{
    if(!name)
        name = sndio_device;
    else if(strcmp(name, sndio_device) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mSndHandle = sio_open(nullptr, SIO_REC, 0);
    if(mSndHandle == nullptr)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open backend device"};

    sio_par par;
    sio_initpar(&par);

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        par.bps = 1;
        par.sig = 1;
        break;
    case DevFmtUByte:
        par.bps = 1;
        par.sig = 0;
        break;
    case DevFmtShort:
        par.bps = 2;
        par.sig = 1;
        break;
    case DevFmtUShort:
        par.bps = 2;
        par.sig = 0;
        break;
    case DevFmtInt:
        par.bps = 4;
        par.sig = 1;
        break;
    case DevFmtUInt:
        par.bps = 4;
        par.sig = 0;
        break;
    case DevFmtFloat:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }
    par.bits = par.bps * 8;
    par.le = SIO_LE_NATIVE;
    par.msb = SIO_LE_NATIVE ? 0 : 1;
    par.rchan = mDevice->channelsFromFmt();
    par.rate = mDevice->Frequency;

    par.appbufsz = maxu(mDevice->BufferSize, mDevice->Frequency/10);
    par.round = minu(par.appbufsz, mDevice->Frequency/40);

    mDevice->UpdateSize = par.round;
    mDevice->BufferSize = par.appbufsz;

    if(!sio_setpar(mSndHandle, &par) || !sio_getpar(mSndHandle, &par))
        throw al::backend_exception{ALC_INVALID_VALUE, "Failed to set device praameters"};

    if(par.bits != par.bps*8)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Padded samples not supported (got %u of %u bits)", par.bits, par.bps*8};

    if(!((mDevice->FmtType == DevFmtByte && par.bits == 8 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUByte && par.bits == 8 && par.sig == 0)
        || (mDevice->FmtType == DevFmtShort && par.bits == 16 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUShort && par.bits == 16 && par.sig == 0)
        || (mDevice->FmtType == DevFmtInt && par.bits == 32 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUInt && par.bits == 32 && par.sig == 0))
        || mDevice->channelsFromFmt() != par.rchan || mDevice->Frequency != par.rate)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set format %s %s %uhz, got %c%u %u-channel %uhz instead",
            DevFmtTypeString(mDevice->FmtType), DevFmtChannelsString(mDevice->FmtChans),
            mDevice->Frequency, par.sig?'s':'u', par.bits, par.rchan, par.rate};

    mRing = RingBuffer::Create(mDevice->BufferSize, par.bps*par.rchan, false);

    setDefaultChannelOrder();

    mDevice->DeviceName = name;
}